

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIButton::setImage
          (CGUIButton *this,EGUI_BUTTON_IMAGE_STATE state,ITexture *image,rect<int> *sourceRect)

{
  ITexture *pIVar1;
  vector2d<int> vVar2;
  
  if ((int)state < 9) {
    if (image != (ITexture *)0x0) {
      *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) =
           *(int *)(image->_vptr_ITexture[-3] + 8 + (long)&(image->NamedPath).Path) + 1;
    }
    pIVar1 = this->ButtonImages[state].Texture;
    if (pIVar1 != (ITexture *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar1->_vptr_ITexture + (long)pIVar1->_vptr_ITexture[-3]));
    }
    this->ButtonImages[state].Texture = image;
    vVar2 = sourceRect->LowerRightCorner;
    this->ButtonImages[state].SourceRect.UpperLeftCorner = sourceRect->UpperLeftCorner;
    this->ButtonImages[state].SourceRect.LowerRightCorner = vVar2;
  }
  return;
}

Assistant:

void CGUIButton::setImage(EGUI_BUTTON_IMAGE_STATE state, video::ITexture *image, const core::rect<s32> &sourceRect)
{
	if (state >= EGBIS_COUNT)
		return;

	if (image)
		image->grab();

	u32 stateIdx = (u32)state;
	if (ButtonImages[stateIdx].Texture)
		ButtonImages[stateIdx].Texture->drop();

	ButtonImages[stateIdx].Texture = image;
	ButtonImages[stateIdx].SourceRect = sourceRect;
}